

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool phmap::priv::operator==
               (raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
                *a,raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
                   *b)

{
  char cVar1;
  ctrl_t *pcVar2;
  size_t sVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [12];
  undefined1 auVar14 [13];
  undefined1 auVar15 [14];
  char *pcVar16;
  bool bVar17;
  uint uVar18;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  *this;
  value_type *elem;
  anon_union_8_1_a8a14541_for_iterator_1 aVar19;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator iVar20;
  
  if (a->size_ != b->size_) {
    return false;
  }
  this = a;
  if (b->capacity_ < a->capacity_) {
    this = b;
    b = a;
  }
  iVar20 = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
           ::begin(this);
  pcVar2 = this->ctrl_;
  sVar3 = this->capacity_;
  if (iVar20.ctrl_ == pcVar2 + sVar3) {
    bVar17 = true;
  }
  else {
    do {
      aVar19 = iVar20.field_1;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (long)*(int *)aVar19.slot_;
      bVar17 = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
               ::has_element(b,(value_type *)aVar19.slot_,
                             SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),8) +
                             SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),0));
      if (!bVar17) {
        return false;
      }
      aVar19.slot_ = aVar19.slot_ + 1;
      cVar1 = iVar20.ctrl_[1];
      pcVar16 = iVar20.ctrl_ + 1;
      while (cVar1 < -1) {
        iVar8 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                       CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
        iVar9 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                       CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
        iVar10 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar11 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar16 < (char)iVar8);
        in_XMM1_Bb = -(pcVar16[1] < (char)((uint)iVar8 >> 8));
        in_XMM1_Bc = -(pcVar16[2] < (char)((uint)iVar8 >> 0x10));
        in_XMM1_Bd = -(pcVar16[3] < (char)((uint)iVar8 >> 0x18));
        in_XMM1_Be = -(pcVar16[4] < (char)iVar9);
        in_XMM1_Bf = -(pcVar16[5] < (char)((uint)iVar9 >> 8));
        in_XMM1_Bg = -(pcVar16[6] < (char)((uint)iVar9 >> 0x10));
        in_XMM1_Bh = -(pcVar16[7] < (char)((uint)iVar9 >> 0x18));
        in_XMM1_Bi = -(pcVar16[8] < (char)iVar10);
        in_XMM1_Bj = -(pcVar16[9] < (char)((uint)iVar10 >> 8));
        in_XMM1_Bk = -(pcVar16[10] < (char)((uint)iVar10 >> 0x10));
        in_XMM1_Bl = -(pcVar16[0xb] < (char)((uint)iVar10 >> 0x18));
        in_XMM1_Bm = -(pcVar16[0xc] < (char)iVar11);
        in_XMM1_Bn = -(pcVar16[0xd] < (char)((uint)iVar11 >> 8));
        in_XMM1_Bo = -(pcVar16[0xe] < (char)((uint)iVar11 >> 0x10));
        in_XMM1_Bp = -(pcVar16[0xf] < (char)((uint)iVar11 >> 0x18));
        auVar6[1] = in_XMM1_Bb;
        auVar6[0] = in_XMM1_Ba;
        auVar6[2] = in_XMM1_Bc;
        auVar6[3] = in_XMM1_Bd;
        auVar6[4] = in_XMM1_Be;
        auVar6[5] = in_XMM1_Bf;
        auVar6[6] = in_XMM1_Bg;
        auVar6[7] = in_XMM1_Bh;
        auVar6[8] = in_XMM1_Bi;
        auVar6[9] = in_XMM1_Bj;
        auVar6[10] = in_XMM1_Bk;
        auVar6[0xb] = in_XMM1_Bl;
        auVar6[0xc] = in_XMM1_Bm;
        auVar6[0xd] = in_XMM1_Bn;
        auVar6[0xe] = in_XMM1_Bo;
        auVar6[0xf] = in_XMM1_Bp;
        auVar7[1] = in_XMM1_Bb;
        auVar7[0] = in_XMM1_Ba;
        auVar7[2] = in_XMM1_Bc;
        auVar7[3] = in_XMM1_Bd;
        auVar7[4] = in_XMM1_Be;
        auVar7[5] = in_XMM1_Bf;
        auVar7[6] = in_XMM1_Bg;
        auVar7[7] = in_XMM1_Bh;
        auVar7[8] = in_XMM1_Bi;
        auVar7[9] = in_XMM1_Bj;
        auVar7[10] = in_XMM1_Bk;
        auVar7[0xb] = in_XMM1_Bl;
        auVar7[0xc] = in_XMM1_Bm;
        auVar7[0xd] = in_XMM1_Bn;
        auVar7[0xe] = in_XMM1_Bo;
        auVar7[0xf] = in_XMM1_Bp;
        auVar15[1] = in_XMM1_Bd;
        auVar15[0] = in_XMM1_Bc;
        auVar15[2] = in_XMM1_Be;
        auVar15[3] = in_XMM1_Bf;
        auVar15[4] = in_XMM1_Bg;
        auVar15[5] = in_XMM1_Bh;
        auVar15[6] = in_XMM1_Bi;
        auVar15[7] = in_XMM1_Bj;
        auVar15[8] = in_XMM1_Bk;
        auVar15[9] = in_XMM1_Bl;
        auVar15[10] = in_XMM1_Bm;
        auVar15[0xb] = in_XMM1_Bn;
        auVar15[0xc] = in_XMM1_Bo;
        auVar15[0xd] = in_XMM1_Bp;
        auVar14[1] = in_XMM1_Be;
        auVar14[0] = in_XMM1_Bd;
        auVar14[2] = in_XMM1_Bf;
        auVar14[3] = in_XMM1_Bg;
        auVar14[4] = in_XMM1_Bh;
        auVar14[5] = in_XMM1_Bi;
        auVar14[6] = in_XMM1_Bj;
        auVar14[7] = in_XMM1_Bk;
        auVar14[8] = in_XMM1_Bl;
        auVar14[9] = in_XMM1_Bm;
        auVar14[10] = in_XMM1_Bn;
        auVar14[0xb] = in_XMM1_Bo;
        auVar14[0xc] = in_XMM1_Bp;
        auVar13[1] = in_XMM1_Bf;
        auVar13[0] = in_XMM1_Be;
        auVar13[2] = in_XMM1_Bg;
        auVar13[3] = in_XMM1_Bh;
        auVar13[4] = in_XMM1_Bi;
        auVar13[5] = in_XMM1_Bj;
        auVar13[6] = in_XMM1_Bk;
        auVar13[7] = in_XMM1_Bl;
        auVar13[8] = in_XMM1_Bm;
        auVar13[9] = in_XMM1_Bn;
        auVar13[10] = in_XMM1_Bo;
        auVar13[0xb] = in_XMM1_Bp;
        auVar12[1] = in_XMM1_Bg;
        auVar12[0] = in_XMM1_Bf;
        auVar12[2] = in_XMM1_Bh;
        auVar12[3] = in_XMM1_Bi;
        auVar12[4] = in_XMM1_Bj;
        auVar12[5] = in_XMM1_Bk;
        auVar12[6] = in_XMM1_Bl;
        auVar12[7] = in_XMM1_Bm;
        auVar12[8] = in_XMM1_Bn;
        auVar12[9] = in_XMM1_Bo;
        auVar12[10] = in_XMM1_Bp;
        uVar18 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar15 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar14 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar13 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar12 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar4 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        aVar19.slot_ = (slot_type *)((long)aVar19.slot_ + (ulong)(uVar4 * 0x30));
        cVar1 = pcVar16[uVar4];
        pcVar16 = pcVar16 + uVar4;
      }
      iVar20.field_1.slot_ = aVar19.slot_;
      iVar20.ctrl_ = pcVar16;
    } while (pcVar16 != pcVar2 + sVar3);
  }
  return bVar17;
}

Assistant:

size_t size() const { return size_; }